

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

int __thiscall
trieste::NodeDef::clone(NodeDef *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined8 *puVar1;
  NodeDef *this_00;
  void *extraout_RDX;
  void *__child_stack_00;
  void *extraout_RDX_00;
  undefined8 *puVar2;
  undefined8 in_R9;
  __weak_count<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  undefined1 local_60 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48 [3];
  
  Location::Location((Location *)(local_60 + 0x10),(Location *)(__fn + 0x18));
  create(this,(Token *)(__fn + 0x10),(Location *)(local_60 + 0x10));
  p_Var3 = &(this->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
            super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_48);
  puVar1 = *(undefined8 **)(__fn + 0x60);
  __child_stack_00 = extraout_RDX;
  for (puVar2 = *(undefined8 **)(__fn + 0x58); puVar2 != puVar1; puVar2 = puVar2 + 2) {
    this_00 = (this->super_enable_shared_from_this<trieste::NodeDef>)._M_weak_this.
              super___weak_ptr<trieste::NodeDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    clone((NodeDef *)local_60,(__fn *)*puVar2,__child_stack_00,__flags,__arg,in_R9,p_Var3);
    push_back(this_00,(Node *)local_60);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
    __child_stack_00 = extraout_RDX_00;
  }
  return (int)this;
}

Assistant:

Node clone()
    {
      // This doesn't preserve the symbol table.
      auto node = create(type_, location_);

      for (auto& child : children)
        node->push_back(child->clone());

      return node;
    }